

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int jmp_list_merge(Parser *psr,int left,int right)

{
  int iVar1;
  BcIns *pBVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = left;
  if ((right == -1) || (iVar1 = right, uVar4 = right, left == -1)) {
    return iVar1;
  }
  do {
    while (uVar3 = uVar4, -1 < (int)uVar3) {
      pBVar2 = psr->vm->fns[psr->scope->fn].ins;
      uVar4 = ((pBVar2[uVar3] >> 8) + uVar3) - 0x7fffff;
      if (uVar4 == 0xffffffff) goto LAB_00110611;
    }
    uVar4 = uVar3;
  } while (uVar3 != 0xffffffff);
  pBVar2 = psr->vm->fns[psr->scope->fn].ins;
LAB_00110611:
  pBVar2[(int)uVar3] = (left - uVar3) * 0x100 + (uint)(byte)pBVar2[(int)uVar3] + 0x7fffff00;
  return right;
}

Assistant:

static int jmp_list_merge(Parser *psr, int left, int right) {
	// If either jump list is empty, the result is trivial
	if (right == -1) {
		return left;
	} else if (left == -1) {
		return right;
	}

	// Find the last element in `right`
	int last = right;
	while (jmp_follow(psr, last) != -1) {
		last = jmp_follow(psr, last);
	}

	// Point the last element in `right` to `left`
	jmp_set_target(psr, last, left);

	// The head of the merged list must be `right`
	return right;
}